

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

void __thiscall Zippy::ZipArchive::Close(ZipArchive *this)

{
  bool bVar1;
  ZipArchive *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = IsOpen(in_RDI);
  if (bVar1) {
    mz_zip_reader_end((mz_zip_archive *)0x1328ac);
  }
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::clear
            ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)0x1328bd);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Close() {

            if (IsOpen())
                mz_zip_reader_end(&m_Archive);
            m_ZipEntries.clear();
            m_ArchivePath = "";
        }